

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall CmdLineParser::onSwitch(CmdLineParser *this,SwitchKind switchKind,StringRef *value)

{
  C *pCVar1;
  char *pcVar2;
  
  switch(switchKind) {
  case CmdLineSwitchKind_Help:
    pcVar2 = "CmdLineSwitchKind_Help";
    break;
  case CmdLineSwitchKind_Version:
    pcVar2 = "CmdLineSwitchKind_Version";
    break;
  case CmdLineSwitchKind_Verbose:
    pcVar2 = "CmdLineSwitchKind_Verbose";
    break;
  case CmdLineSwitchKind_Add:
    if (value->m_length == 0) {
      pCVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    else {
      pCVar1 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                         (value);
    }
    pcVar2 = "CmdLineSwitchKind_Add (%s)\n";
    goto LAB_0011fbce;
  case CmdLineSwitchKind_Remove:
    if (value->m_length == 0) {
      pCVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    else {
      pCVar1 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                         (value);
    }
    pcVar2 = "CmdLineSwitchKind_Remove (%s)\n";
LAB_0011fbce:
    printf(pcVar2,pCVar1);
  default:
    goto switchD_0011fb66_default;
  }
  puts(pcVar2);
switchD_0011fb66_default:
  return true;
}

Assistant:

bool
	onSwitch(
		SwitchKind switchKind,
		const sl::StringRef& value
	) {
		switch (switchKind) {
		case CmdLineSwitchKind_Help:
			printf("CmdLineSwitchKind_Help\n");
			break;

		case CmdLineSwitchKind_Version:
			printf("CmdLineSwitchKind_Version\n");
			break;

		case CmdLineSwitchKind_Verbose:
			printf("CmdLineSwitchKind_Verbose\n");
			break;

		case CmdLineSwitchKind_Add:
			printf("CmdLineSwitchKind_Add (%s)\n", value.sz());
			break;

		case CmdLineSwitchKind_Remove:
			printf("CmdLineSwitchKind_Remove (%s)\n", value.sz());
			break;

		};

		return true;
	}